

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_struct_of_struct_Test::TestBody(expr_struct_of_struct_Test *this)

{
  allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
  *this_00;
  __node_base_ptr *this_01;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
  __l;
  bool bVar1;
  element_type *peVar2;
  Generator *pGVar3;
  PackedSlice *pPVar4;
  char *message;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  *local_8d8;
  AssertHelper local_8c0;
  Message local_8b8;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar;
  string str;
  string local_878;
  allocator<char> local_851;
  string local_850;
  PackedSlice *local_830;
  PackedSlice *slice;
  element_type *var;
  undefined1 local_818 [8];
  shared_ptr<kratos::VarPackedStruct> var_;
  string local_800;
  undefined1 local_7e0 [8];
  Generator mod;
  Context c;
  PackedStructFieldDef attr;
  shared_ptr<kratos::PackedStruct> struct2;
  bool local_10d;
  int local_10c;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  *local_108;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  local_100;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  local_d8;
  undefined1 local_b0 [63];
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  PackedStruct struct1;
  expr_struct_of_struct_Test *this_local;
  
  struct1._56_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"data1",&local_71);
  local_108 = &local_100;
  local_10c = 1;
  local_10d = false;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  ::tuple<const_char_(&)[7],_int,_bool,_true,_true>
            (local_108,(char (*) [7])0x447984,&local_10c,&local_10d);
  local_108 = &local_d8;
  struct2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = 2;
  struct2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _3_1_ = 0;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  ::tuple<const_char_(&)[7],_int,_bool,_true,_true>
            (local_108,(char (*) [7])0x4476ff,
             (int *)((long)&struct2.
                            super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (bool *)((long)&struct2.
                             super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 3));
  local_b0._0_8_ = &local_100;
  local_b0._8_8_ = 2;
  this_00 = (allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
             *)((long)&struct2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 2);
  std::
  allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
  ::allocator(this_00);
  __l._M_len = local_b0._8_8_;
  __l._M_array = (iterator)local_b0._0_8_;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
            *)(local_b0 + 0x10),__l,this_00);
  kratos::PackedStruct::PackedStruct
            ((PackedStruct *)local_50,&local_70,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
              *)(local_b0 + 0x10));
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
             *)(local_b0 + 0x10));
  std::
  allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
  ::~allocator((allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
                *)((long)&struct2.
                          super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 2));
  local_8d8 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
               *)local_b0;
  do {
    local_8d8 = local_8d8 + -1;
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
    ::~tuple(local_8d8);
  } while (local_8d8 != &local_100);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::make_shared<kratos::PackedStruct,char_const(&)[6]>((char (*) [6])&attr.struct_);
  attr.name.field_2._8_8_ = 0;
  attr.width = 0;
  attr.signed_ = false;
  attr._37_3_ = 0;
  attr.name._M_string_length = 0;
  attr.name.field_2._M_allocated_capacity = 0;
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  attr.name._M_dataplus = (_Alloc_hider)0x0;
  attr.name._1_7_ = 0;
  this_01 = &c.tracked_generators_._M_h._M_single_bucket;
  kratos::PackedStructFieldDef::PackedStructFieldDef((PackedStructFieldDef *)this_01);
  std::__cxx11::string::operator=((string *)this_01,"value");
  attr._32_8_ = local_50;
  peVar2 = std::__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&attr.struct_);
  std::vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>>::
  emplace_back<kratos::PackedStructFieldDef&>
            ((vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>> *)
             &peVar2->attributes,
             (PackedStructFieldDef *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Context::Context((Context *)&mod.use_stmts_remove_cache_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,"mod",
             (allocator<char> *)
             ((long)&var_.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pGVar3 = kratos::Context::generator((Context *)&mod.use_stmts_remove_cache_,&local_800);
  kratos::Generator::Generator((Generator *)local_7e0,pGVar3);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&var_.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  var = (element_type *)local_7e0;
  std::
  make_shared<kratos::VarPackedStruct,kratos::Generator*,char_const(&)[3],std::shared_ptr<kratos::PackedStruct>&>
            ((Generator **)local_818,(char (*) [3])&var,(shared_ptr<kratos::PackedStruct> *)0x45782e
            );
  pPVar4 = (PackedSlice *)
           std::
           __shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_818);
  slice = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,"value",&local_851);
  pPVar4 = kratos::VarPackedStruct::operator[]((VarPackedStruct *)pPVar4,&local_850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_878,"value1",(allocator<char> *)(str.field_2._M_local_buf + 0xf));
  pPVar4 = kratos::VarSlice::operator[](&pPVar4->super_VarSlice,&local_878);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  local_830 = pPVar4;
  (*(pPVar4->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x1f])(&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[16],_nullptr>
            ((EqHelper *)local_8b0,"str","\"in.value.value1\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [16])"in.value.value1");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xd2,message);
    testing::internal::AssertHelper::operator=(&local_8c0,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper(&local_8c0);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::shared_ptr<kratos::VarPackedStruct>::~shared_ptr
            ((shared_ptr<kratos::VarPackedStruct> *)local_818);
  kratos::Generator::~Generator((Generator *)local_7e0);
  kratos::Context::~Context((Context *)&mod.use_stmts_remove_cache_);
  kratos::PackedStructFieldDef::~PackedStructFieldDef
            ((PackedStructFieldDef *)&c.tracked_generators_._M_h._M_single_bucket);
  std::shared_ptr<kratos::PackedStruct>::~shared_ptr
            ((shared_ptr<kratos::PackedStruct> *)&attr.struct_);
  kratos::PackedStruct::~PackedStruct((PackedStruct *)local_50);
  return;
}

Assistant:

TEST(expr, struct_of_struct) {  // NOLINT
    auto struct1 = PackedStruct("data1", {{"value1", 1, false}, {"value2", 2, false}});
    auto struct2 = std::make_shared<PackedStruct>("data2");
    auto attr = PackedStructFieldDef();
    attr.name = "value";
    attr.struct_ = &struct1;
    struct2->attributes.emplace_back(attr);

    Context c;
    auto mod = c.generator("mod");

    auto var_ = std::make_shared<VarPackedStruct>(&mod, "in", struct2);
    auto &var = *var_;

    auto &slice = var["value"]["value1"];
    auto str = slice.to_string();
    EXPECT_EQ(str, "in.value.value1");
}